

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathLine.h
# Opt level: O0

Vec3<float> __thiscall Imath_3_2::Line3<float>::operator()(Line3<float> *this,float parameter)

{
  Vec3<float> *in_RSI;
  Vec3<float> *in_RDI;
  Vec3<float> VVar1;
  
  Vec3<float>::operator*(in_RDI,(float)((ulong)in_RSI >> 0x20));
  VVar1 = Vec3<float>::operator+(in_RDI,in_RSI);
  return VVar1;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Vec3<T>
Line3<T>::operator() (T parameter) const IMATH_NOEXCEPT
{
    return pos + dir * parameter;
}